

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

void QMakeEvaluator::initStatics(void)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  uint i;
  piter in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  uint uVar3;
  QLatin1String *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  QLatin1String *local_118;
  QLatin1String *local_108;
  QLatin1String *local_f8;
  QLatin1String *local_e8;
  QLatin1String *local_d8;
  QLatin1String *local_38;
  QLatin1String *local_28;
  QLatin1String *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QString::isNull((QString *)0x2ee9d8);
  if (bVar2) {
    QLatin1String::QLatin1String
              (in_stack_fffffffffffffd50,
               (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    QString::operator=((QString *)QMakeInternal::statics,local_18);
    QLatin1String::QLatin1String
              (in_stack_fffffffffffffd50,
               (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    QString::operator=((QString *)(QMakeInternal::statics + 0x18),local_28);
    QLatin1String::QLatin1String
              (in_stack_fffffffffffffd50,
               (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    QString::operator=((QString *)(QMakeInternal::statics + 0x30),local_38);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd38.bucket,(char *)in_stack_fffffffffffffd38.d);
    ProKey::operator=((ProKey *)in_stack_fffffffffffffd38.bucket,
                      (ProKey *)in_stack_fffffffffffffd38.d);
    ProKey::~ProKey((ProKey *)0x2eeab2);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd38.bucket,(char *)in_stack_fffffffffffffd38.d);
    ProKey::operator=((ProKey *)in_stack_fffffffffffffd38.bucket,
                      (ProKey *)in_stack_fffffffffffffd38.d);
    ProKey::~ProKey((ProKey *)0x2eeaeb);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd38.bucket,(char *)in_stack_fffffffffffffd38.d);
    ProKey::operator=((ProKey *)in_stack_fffffffffffffd38.bucket,
                      (ProKey *)in_stack_fffffffffffffd38.d);
    ProKey::~ProKey((ProKey *)0x2eeb27);
    QLatin1String::QLatin1String
              (in_stack_fffffffffffffd50,
               (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    QString::operator=((QString *)(QMakeInternal::statics + 0xd8),local_d8);
    QLatin1String::QLatin1String
              (in_stack_fffffffffffffd50,
               (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    QString::operator=((QString *)(QMakeInternal::statics + 0xf0),local_e8);
    QLatin1String::QLatin1String
              (in_stack_fffffffffffffd50,
               (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    QString::operator=((QString *)(QMakeInternal::statics + 0x108),local_f8);
    QLatin1String::QLatin1String
              (in_stack_fffffffffffffd50,
               (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    QString::operator=((QString *)(QMakeInternal::statics + 0x120),local_108);
    QLatin1String::QLatin1String
              (in_stack_fffffffffffffd50,
               (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    QString::operator=((QString *)(QMakeInternal::statics + 0x138),local_118);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd38.bucket,(char *)in_stack_fffffffffffffd38.d);
    ProKey::operator=((ProKey *)in_stack_fffffffffffffd38.bucket,
                      (ProKey *)in_stack_fffffffffffffd38.d);
    ProKey::~ProKey((ProKey *)0x2eec76);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd38.bucket,(char *)in_stack_fffffffffffffd38.d);
    ProKey::operator=((ProKey *)in_stack_fffffffffffffd38.bucket,
                      (ProKey *)in_stack_fffffffffffffd38.d);
    ProKey::~ProKey((ProKey *)0x2eecb2);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd38.bucket,(char *)in_stack_fffffffffffffd38.d);
    ProKey::operator=((ProKey *)in_stack_fffffffffffffd38.bucket,
                      (ProKey *)in_stack_fffffffffffffd38.d);
    ProKey::~ProKey((ProKey *)0x2eecee);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd38.bucket,(char *)in_stack_fffffffffffffd38.d);
    ProKey::operator=((ProKey *)in_stack_fffffffffffffd38.bucket,
                      (ProKey *)in_stack_fffffffffffffd38.d);
    ProKey::~ProKey((ProKey *)0x2eed2a);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd38.bucket,(char *)in_stack_fffffffffffffd38.d);
    ProKey::operator=((ProKey *)in_stack_fffffffffffffd38.bucket,
                      (ProKey *)in_stack_fffffffffffffd38.d);
    ProKey::~ProKey((ProKey *)0x2eed66);
    ProString::ProString((ProString *)in_stack_fffffffffffffd38.bucket,in_stack_fffffffffffffd58);
    ProStringList::ProStringList
              ((ProStringList *)in_stack_fffffffffffffd38.bucket,
               (ProString *)in_stack_fffffffffffffd38.d);
    ProStringList::operator=
              ((ProStringList *)in_stack_fffffffffffffd38.bucket,
               (ProStringList *)in_stack_fffffffffffffd38.d);
    ProStringList::~ProStringList((ProStringList *)0x2eedb1);
    ProString::~ProString((ProString *)0x2eedbb);
    initFunctionStatics();
    QHash<ProKey,_ProKey>::reserve
              ((QHash<ProKey,_ProKey> *)in_stack_fffffffffffffd38.bucket,
               (qsizetype)in_stack_fffffffffffffd38.d);
    for (uVar3 = 0; uVar3 < 0x15; uVar3 = uVar3 + 1) {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffd38.bucket,(char *)in_stack_fffffffffffffd38.d)
      ;
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffd38.bucket,(char *)in_stack_fffffffffffffd38.d)
      ;
      in_stack_fffffffffffffd38 =
           (piter)QHash<ProKey,_ProKey>::insert
                            ((QHash<ProKey,_ProKey> *)in_stack_fffffffffffffd38.bucket,
                             (ProKey *)in_stack_fffffffffffffd38.d,(ProKey *)0x2eee4e);
      ProKey::~ProKey((ProKey *)0x2eee61);
      ProKey::~ProKey((ProKey *)0x2eee6b);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeEvaluator::initStatics()
{
    if (!statics.field_sep.isNull())
        return;

    statics.field_sep = QLatin1String(" ");
    statics.strtrue = QLatin1String("true");
    statics.strfalse = QLatin1String("false");
    statics.strCONFIG = ProKey("CONFIG");
    statics.strARGS = ProKey("ARGS");
    statics.strARGC = ProKey("ARGC");
    statics.strDot = QLatin1String(".");
    statics.strDotDot = QLatin1String("..");
    statics.strever = QLatin1String("ever");
    statics.strforever = QLatin1String("forever");
    statics.strhost_build = QLatin1String("host_build");
    statics.strTEMPLATE = ProKey("TEMPLATE");
    statics.strQMAKE_PLATFORM = ProKey("QMAKE_PLATFORM");
    statics.strQMAKE_DIR_SEP = ProKey("QMAKE_DIR_SEP");
    statics.strQMAKESPEC = ProKey("QMAKESPEC");
#ifdef PROEVALUATOR_FULL
    statics.strREQUIRES = ProKey("REQUIRES");
#endif

    statics.fakeValue = ProStringList(ProString("_FAKE_")); // It has to have a unique begin() value

    initFunctionStatics();

    static const struct {
        const char * const oldname, * const newname;
    } mapInits[] = {
        { "INTERFACES", "FORMS" },
        { "QMAKE_POST_BUILD", "QMAKE_POST_LINK" },
        { "TARGETDEPS", "POST_TARGETDEPS" },
        { "LIBPATH", "QMAKE_LIBDIR" },
        { "QMAKE_EXT_MOC", "QMAKE_EXT_CPP_MOC" },
        { "QMAKE_MOD_MOC", "QMAKE_H_MOD_MOC" },
        { "QMAKE_LFLAGS_SHAPP", "QMAKE_LFLAGS_APP" },
        { "PRECOMPH", "PRECOMPILED_HEADER" },
        { "PRECOMPCPP", "PRECOMPILED_SOURCE" },
        { "INCPATH", "INCLUDEPATH" },
        { "QMAKE_EXTRA_WIN_COMPILERS", "QMAKE_EXTRA_COMPILERS" },
        { "QMAKE_EXTRA_UNIX_COMPILERS", "QMAKE_EXTRA_COMPILERS" },
        { "QMAKE_EXTRA_WIN_TARGETS", "QMAKE_EXTRA_TARGETS" },
        { "QMAKE_EXTRA_UNIX_TARGETS", "QMAKE_EXTRA_TARGETS" },
        { "QMAKE_EXTRA_UNIX_INCLUDES", "QMAKE_EXTRA_INCLUDES" },
        { "QMAKE_EXTRA_UNIX_VARIABLES", "QMAKE_EXTRA_VARIABLES" },
        { "QMAKE_RPATH", "QMAKE_LFLAGS_RPATH" },
        { "QMAKE_FRAMEWORKDIR", "QMAKE_FRAMEWORKPATH" },
        { "QMAKE_FRAMEWORKDIR_FLAGS", "QMAKE_FRAMEWORKPATH_FLAGS" },
        { "IN_PWD", "PWD" },
        { "DEPLOYMENT", "INSTALLS" }
    };
    statics.varMap.reserve((int)(sizeof(mapInits)/sizeof(mapInits[0])));
    for (unsigned i = 0; i < sizeof(mapInits)/sizeof(mapInits[0]); ++i)
        statics.varMap.insert(ProKey(mapInits[i].oldname), ProKey(mapInits[i].newname));
}